

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.h
# Opt level: O2

void __thiscall llvm::APFloat::makeInf(APFloat *this,bool Neg)

{
  if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
    detail::IEEEFloat::makeInf(&(this->U).IEEE,Neg);
    return;
  }
  detail::DoubleAPFloat::makeInf((DoubleAPFloat *)&(this->U).IEEE,Neg);
  return;
}

Assistant:

void makeInf(bool Neg) { APFLOAT_DISPATCH_ON_SEMANTICS(makeInf(Neg)); }